

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QItemSelectionRange>::growAppend
          (QCommonArrayOps<QItemSelectionRange> *this,QItemSelectionRange *b,QItemSelectionRange *e)

{
  long n;
  QItemSelectionRange *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_48;
  QItemSelectionRange *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = (long)e - (long)b >> 4;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QItemSelectionRange *)0x0;
    pQVar1 = (this->super_Type).super_QGenericArrayOps<QItemSelectionRange>.
             super_QArrayDataPointer<QItemSelectionRange>.ptr;
    if ((b < pQVar1) ||
       (pQVar1 + (this->super_Type).super_QGenericArrayOps<QItemSelectionRange>.
                 super_QArrayDataPointer<QItemSelectionRange>.size <= b)) {
      QArrayDataPointer<QItemSelectionRange>::detachAndGrow
                ((QArrayDataPointer<QItemSelectionRange> *)this,GrowsAtEnd,n,
                 (QItemSelectionRange **)0x0,(QArrayDataPointer<QItemSelectionRange> *)0x0);
      pQVar1 = b;
    }
    else {
      QArrayDataPointer<QItemSelectionRange>::detachAndGrow
                ((QArrayDataPointer<QItemSelectionRange> *)this,GrowsAtEnd,n,&local_28,&local_48);
      pQVar1 = local_28;
    }
    QGenericArrayOps<QItemSelectionRange>::copyAppend
              ((QGenericArrayOps<QItemSelectionRange> *)this,pQVar1,
               (QItemSelectionRange *)(((long)e - (long)b) + (long)pQVar1));
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }